

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

int winmd::reader::parse_ptr(table_base *param_1,byte_view *data)

{
  ElementType EVar1;
  int local_2c;
  undefined1 auStack_28 [4];
  int result;
  byte_view cursor;
  byte_view *data_local;
  table_base *param_0_local;
  
  _auStack_28 = data->m_first;
  cursor.m_first = data->m_last;
  local_2c = 0;
  cursor.m_last = (uint8_t *)data;
  while( true ) {
    EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)auStack_28);
    if (EVar1 != Ptr) break;
    local_2c = local_2c + 1;
    *(uint8_t **)cursor.m_last = _auStack_28;
    *(uint8_t **)(cursor.m_last + 8) = cursor.m_first;
  }
  return local_2c;
}

Assistant:

inline int parse_ptr(table_base const*, byte_view& data)
    {
        auto cursor = data;
        int result = 0;
        while(uncompress_enum<ElementType>(cursor) == ElementType::Ptr)
        {
            ++result;
            data = cursor;
        }
        return result;
    }